

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O2

void __thiscall
QMakeParser::enterScope(QMakeParser *this,ushort **tokPtr,bool special,ScopeState state)

{
  QStack<QMakeParser::BlockScope> *this_00;
  uchar uVar1;
  ushort *puVar2;
  iterator iVar3;
  undefined3 in_register_00000011;
  
  this_00 = &this->m_blockstack;
  iVar3 = QList<QMakeParser::BlockScope>::end(&this_00->super_QList<QMakeParser::BlockScope>);
  uVar1 = iVar3.i[-1].nest;
  QList<QMakeParser::BlockScope>::resize
            (&this_00->super_QList<QMakeParser::BlockScope>,
             (this->m_blockstack).super_QList<QMakeParser::BlockScope>.d.size + 1);
  iVar3 = QList<QMakeParser::BlockScope>::end(&this_00->super_QList<QMakeParser::BlockScope>);
  iVar3.i[-1].special = special;
  puVar2 = *tokPtr;
  iVar3 = QList<QMakeParser::BlockScope>::end(&this_00->super_QList<QMakeParser::BlockScope>);
  iVar3.i[-1].start = puVar2;
  iVar3 = QList<QMakeParser::BlockScope>::end(&this_00->super_QList<QMakeParser::BlockScope>);
  iVar3.i[-1].nest = uVar1;
  *tokPtr = *tokPtr + 2;
  this->m_state = state;
  this->m_canElse = false;
  if (CONCAT31(in_register_00000011,special) != 0) {
    this->m_markLine = this->m_lineNo;
  }
  return;
}

Assistant:

void QMakeParser::enterScope(ushort *&tokPtr, bool special, ScopeState state)
{
    uchar nest = m_blockstack.top().nest;
    m_blockstack.resize(m_blockstack.size() + 1);
    m_blockstack.top().special = special;
    m_blockstack.top().start = tokPtr;
    m_blockstack.top().nest = nest;
    tokPtr += 2;
    m_state = state;
    m_canElse = false;
    if (special)
        m_markLine = m_lineNo;
}